

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O0

wchar_t pfdistances_to_path(pfdistances *a,loc grid,int16_t **step_dirs)

{
  int iVar1;
  _Bool _Var2;
  loc lVar3;
  int local_64;
  int local_5c;
  int iStack_4c;
  wchar_t try_distance;
  loc next;
  wchar_t best_distance;
  wchar_t best_k;
  wchar_t k;
  wchar_t length;
  wchar_t allocated;
  int16_t *steps;
  int16_t **step_dirs_local;
  pfdistances *a_local;
  int iStack_10;
  loc grid_local;
  
  if (((((a == (pfdistances *)0x0) || (iStack_10 = grid.y, (long)grid < 0)) ||
       (a->height <= iStack_10)) ||
      ((a_local._4_4_ = grid.x, a_local._4_4_ < 0 || (a->width <= a_local._4_4_)))) ||
     (a->rows[iStack_10][a_local._4_4_] < 0)) {
    if (step_dirs != (int16_t **)0x0) {
      *step_dirs = (int16_t *)0x0;
    }
    grid_local.x = -1;
  }
  else {
    _Var2 = loc_eq(grid,a->start);
    if (_Var2) {
      if (step_dirs != (int16_t **)0x0) {
        *step_dirs = (int16_t *)0x0;
      }
      grid_local.x = 0;
    }
    else {
      if (iStack_10 - (a->start).y < 0) {
        local_5c = -(iStack_10 - (a->start).y);
      }
      else {
        local_5c = iStack_10 - (a->start).y;
      }
      if (a_local._4_4_ - (a->start).x < 0) {
        local_64 = -(a_local._4_4_ - (a->start).x);
      }
      else {
        local_64 = a_local._4_4_ - (a->start).x;
      }
      k = local_5c + 2 + local_64;
      best_k = L'\0';
      _length = (int16_t *)mem_alloc((long)k << 1);
      unique0x100002fc = grid;
      while (_Var2 = loc_eq(stack0xffffffffffffffec,a->start), ((_Var2 ^ 0xffU) & 1) != 0) {
        next.y = -1;
        next.x = a->rows[iStack_10][a_local._4_4_];
        for (best_distance = L'\0'; best_distance < L'\b'; best_distance = best_distance + L'\x01')
        {
          lVar3 = loc_sum(stack0xffffffffffffffec,ddgrid_ddd[best_distance]);
          try_distance = lVar3.y;
          if ((((long)lVar3 < 0) || (a->height <= try_distance)) ||
             ((iStack_4c = lVar3.x, iStack_4c < 0 || (a->width <= iStack_4c)))) {
            __assert_fail("next.y >= 0 && next.y < a->height && next.x >= 0 && next.x < a->width",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                          ,0x247,
                          "int pfdistances_to_path(const struct pfdistances *, struct loc, int16_t **)"
                         );
          }
          iVar1 = a->rows[try_distance][iStack_4c];
          if ((-1 < iVar1) && (iVar1 < next.x)) {
            next.y = best_distance;
            next.x = iVar1;
          }
        }
        if (next.y < 0) {
          mem_free(_length);
          if (step_dirs != (int16_t **)0x0) {
            *step_dirs = (int16_t *)0x0;
          }
          return L'\xffffffff';
        }
        if ((k < best_k) || (k < L'\x01')) {
          __assert_fail("length <= allocated && allocated > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                        ,0x25a,
                        "int pfdistances_to_path(const struct pfdistances *, struct loc, int16_t **)"
                       );
        }
        if (best_k == k) {
          if ((L'\x3fffffff' < k) || (0x3fffffffffffffff < (ulong)(long)k)) {
            mem_free(_length);
            if (step_dirs != (int16_t **)0x0) {
              *step_dirs = (int16_t *)0x0;
            }
            return L'\xffffffff';
          }
          k = k << 1;
          _length = (int16_t *)mem_realloc(_length,(long)k << 1);
        }
        _length[best_k] = 10 - ddd[next.y];
        best_k = best_k + L'\x01';
        register0x00000000 = loc_sum(stack0xffffffffffffffec,ddgrid_ddd[next.y]);
      }
      if (step_dirs == (int16_t **)0x0) {
        mem_free(_length);
      }
      else {
        *step_dirs = _length;
      }
      grid_local.x = best_k;
    }
  }
  return grid_local.x;
}

Assistant:

int pfdistances_to_path(const struct pfdistances *a, struct loc grid,
		int16_t **step_dirs)
{
	int16_t *steps;
	int allocated, length;

	if (!a || grid.y < 0 || grid.y >= a->height || grid.x < 0 ||
			grid.x >= a->width || a->rows[grid.y][grid.x] < 0) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}
	if (loc_eq(grid, a->start)) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return 0;
	}

	/* Work backwards from the destination to the starting point. */
	allocated = 2 + ABS(grid.y - a->start.y) + ABS(grid.x - a->start.x);
	length = 0;
	steps = mem_alloc(allocated * sizeof(*steps));
	while (!loc_eq(grid, a->start)) {
		int k, best_k = -1, best_distance = a->rows[grid.y][grid.x];

		/* Find the next step. */
		for (k = 0; k < 8; ++k) {
			struct loc next = loc_sum(grid, ddgrid_ddd[k]);
			int try_distance;

			/*
			 * The impassable boundary imposed on the distances
			 * array should mean the trial step is always in bounds.
			 */
			assert(next.y >= 0 && next.y < a->height
				&& next.x >= 0 && next.x < a->width);
			try_distance = a->rows[next.y][next.x];
			if (try_distance >= 0 && best_distance > try_distance) {
				best_distance = try_distance;
				best_k = k;
			}
		}

		/*
		 * Bail out if stepping backwards did not improve the distance.
		 */
		if (best_k < 0) {
			mem_free(steps);
			if (step_dirs) {
				*step_dirs = NULL;
			}
			return -1;
		}

		assert(length <= allocated && allocated > 0);
		if (length == allocated) {
			if (allocated > INT_MAX / 2
					|| (size_t)allocated
					> SIZE_MAX / (2 * sizeof(*steps))) {
				mem_free(steps);
				if (step_dirs) {
					*step_dirs = NULL;
				}
				return -1;
			}
			allocated *= 2;
			steps = mem_realloc(steps, allocated * sizeof(*steps));
		}

		/* Record the opposite of the backward direction. */
		steps[length] = 10 - ddd[best_k];
		++length;

		grid = loc_sum(grid, ddgrid_ddd[best_k]);
	}

	if (step_dirs) {
		*step_dirs = steps;
	} else {
		mem_free(steps);
	}
	return length;
}